

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveIn::in<chrono::ChAparticle*>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>_>
          *bVal)

{
  vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *pvVar1;
  pointer ppCVar2;
  ulong uVar3;
  ChAparticle *element;
  size_t arraysize;
  ChFunctorArchiveInSpecificPtr<chrono::ChAparticle> specFuncA;
  char idname [20];
  ChAparticle *local_80;
  size_type local_78;
  undefined **local_70;
  ChAparticle **local_68;
  char *local_60;
  undefined ***local_58;
  undefined1 local_50;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  ppCVar2 = (pvVar1->
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (pvVar1->super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_78);
  std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>::resize
            (bVal->_value,local_78);
  if (local_78 != 0) {
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      local_68 = &local_80;
      local_58 = &local_70;
      local_70 = &PTR__ChFunctorArchiveIn_00b0eaa0;
      local_50 = 0;
      local_60 = local_48;
      (**(code **)(*(long *)this + 0x68))(this,&local_60);
      (bVal->_value->
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar3] = local_80;
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_78);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }